

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O0

void __thiscall Js::JavascriptStaticEnumerator::Reset(JavascriptStaticEnumerator *this)

{
  JavascriptEnumerator **ppJVar1;
  JavascriptEnumerator *pJVar2;
  JavascriptStaticEnumerator *this_local;
  
  ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptEnumerator__
                      ((WriteBarrierPtr *)&this->prefixEnumerator);
  if (*ppJVar1 == (JavascriptEnumerator *)0x0) {
    ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptEnumerator__
                        ((WriteBarrierPtr *)&this->arrayEnumerator);
    if (*ppJVar1 != (JavascriptEnumerator *)0x0) {
      Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator=
                (&this->currentEnumerator,&this->arrayEnumerator);
      pJVar2 = Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator->(&this->arrayEnumerator)
      ;
      (*(pJVar2->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x62])();
    }
  }
  else {
    pJVar2 = Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator->(&this->prefixEnumerator);
    (*(pJVar2->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x62])();
    Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator=
              (&this->currentEnumerator,&this->prefixEnumerator);
    ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptEnumerator__
                        ((WriteBarrierPtr *)&this->arrayEnumerator);
    if (*ppJVar1 != (JavascriptEnumerator *)0x0) {
      pJVar2 = Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator->(&this->arrayEnumerator)
      ;
      (*(pJVar2->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x62])();
    }
  }
  DynamicObjectPropertyEnumerator::Reset(&this->propertyEnumerator);
  return;
}

Assistant:

void JavascriptStaticEnumerator::Reset()
    {
        if (this->prefixEnumerator)
        {
            this->prefixEnumerator->Reset();
            this->currentEnumerator = this->prefixEnumerator;
            if (this->arrayEnumerator)
            {
                this->arrayEnumerator->Reset();
            }
        }
        else if (this->arrayEnumerator)
        {
            this->currentEnumerator = this->arrayEnumerator;
            this->arrayEnumerator->Reset();
        }
        this->propertyEnumerator.Reset();
    }